

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O2

void multi_kv_custom_cmp_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  char *__format;
  fdb_doc *doc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *db;
  uint local_574;
  fdb_kvs_handle *kv2;
  fdb_iterator *it;
  fdb_kvs_config local_560;
  char value [256];
  timeval __test_begin;
  char key [256];
  fdb_config local_330;
  char valueBuf [256];
  char keyBuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  builtin_strncpy(value,"rm -rf  multi_kv_test*",0x17);
  system(value);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_330.seqtree_opt = '\x01';
  local_330.multi_kv_instances = true;
  local_330.wal_threshold = 0x100;
  local_330.wal_flush_before_commit = false;
  local_330.buffercache_size = 0;
  fVar3 = fdb_open(&dbfile,"./multi_kv_test",&local_330);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x724);
    multi_kv_custom_cmp_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x724,"void multi_kv_custom_cmp_test()");
  }
  fVar3 = fdb_kvs_open(dbfile,&db,(char *)0x0,&local_560);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x726);
    multi_kv_custom_cmp_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x726,"void multi_kv_custom_cmp_test()");
  }
  for (uVar7 = 0; uVar7 != 1000; uVar7 = uVar7 + 1) {
    sprintf(key,"key%06d",(ulong)uVar7);
    sprintf(value,"value%08d(%s)",(ulong)uVar7);
    sVar5 = strlen(key);
    sVar6 = strlen(value);
    fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,value,sVar6 + 1);
    fVar3 = fdb_set(db,doc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x72e);
      multi_kv_custom_cmp_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x72e,"void multi_kv_custom_cmp_test()");
    }
    fdb_doc_free(doc);
  }
  fVar3 = fdb_commit(dbfile,'\0');
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x732);
    multi_kv_custom_cmp_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x732,"void multi_kv_custom_cmp_test()");
  }
  local_560.custom_cmp = _multi_kv_test_keycmp;
  fVar3 = fdb_kvs_open(dbfile,&kv1,"kv1",&local_560);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x737);
    multi_kv_custom_cmp_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x737,"void multi_kv_custom_cmp_test()");
  }
  for (uVar7 = 0; uVar7 != 1000; uVar7 = uVar7 + 1) {
    sprintf(key,"key%06d",(ulong)uVar7);
    sprintf(value,"value%08d(%s)",(ulong)uVar7);
    sVar5 = strlen(key);
    sVar6 = strlen(value);
    fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,value,sVar6 + 1);
    fVar3 = fdb_set(kv1,doc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x73f);
      multi_kv_custom_cmp_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x73f,"void multi_kv_custom_cmp_test()");
    }
    fdb_doc_free(doc);
  }
  fVar3 = fdb_commit(dbfile,'\0');
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x743);
    multi_kv_custom_cmp_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x743,"void multi_kv_custom_cmp_test()");
  }
  uVar7 = 0;
  while( true ) {
    if (uVar7 == 1000) {
      fVar3 = fdb_close(dbfile);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x759);
        multi_kv_custom_cmp_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x759,"void multi_kv_custom_cmp_test()");
      }
      local_560.custom_cmp = (fdb_custom_cmp_variable)0x0;
      fVar3 = fdb_open(&dbfile,"./multi_kv_test",&local_330);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x75c);
        multi_kv_custom_cmp_test()::__test_pass = 1;
        __assert_fail("s != FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x75c,"void multi_kv_custom_cmp_test()");
      }
      keyBuf[0] = '\0';
      keyBuf[1] = '\0';
      keyBuf[2] = '\0';
      keyBuf[3] = '\0';
      keyBuf[4] = '\0';
      keyBuf[5] = '\0';
      keyBuf[6] = '\0';
      keyBuf[7] = '\0';
      valueBuf._0_8_ = _multi_kv_test_keycmp;
      fVar3 = fdb_open_custom_cmp(&dbfile,"./multi_kv_test",&local_330,1,(char **)keyBuf,
                                  (fdb_custom_cmp_variable *)valueBuf,(void **)0x0);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x763);
        multi_kv_custom_cmp_test()::__test_pass = 1;
        __assert_fail("s != FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x763,"void multi_kv_custom_cmp_test()");
      }
      keyBuf._0_8_ = anon_var_dwarf_35ad;
      valueBuf._0_8_ = _multi_kv_test_keycmp;
      fVar3 = fdb_open_custom_cmp(&dbfile,"./multi_kv_test",&local_330,1,(char **)keyBuf,
                                  (fdb_custom_cmp_variable *)valueBuf,(void **)0x0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x76b);
        multi_kv_custom_cmp_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x76b,"void multi_kv_custom_cmp_test()");
      }
      fVar3 = fdb_kvs_open(dbfile,&db,(char *)0x0,&local_560);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x76f);
        multi_kv_custom_cmp_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x76f,"void multi_kv_custom_cmp_test()");
      }
      fVar3 = fdb_kvs_open(dbfile,&kv1,"kv1",&local_560);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x771);
        multi_kv_custom_cmp_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x771,"void multi_kv_custom_cmp_test()");
      }
      uVar7 = 0;
      while( true ) {
        if (uVar7 == 1000) {
          local_560.custom_cmp = (fdb_custom_cmp_variable)0x0;
          fVar3 = fdb_kvs_open(dbfile,&kv2,"kv2",&local_560);
          if (fVar3 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x788);
            multi_kv_custom_cmp_test()::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x788,"void multi_kv_custom_cmp_test()");
          }
          for (uVar7 = 0; uVar7 != 1000; uVar7 = uVar7 + 1) {
            sprintf(key,"key%06d",(ulong)uVar7);
            sprintf(value,"value%08d(%s)",(ulong)uVar7);
            sVar5 = strlen(key);
            sVar6 = strlen(value);
            fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,value,sVar6 + 1);
            fVar3 = fdb_set(kv2,doc);
            if (fVar3 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x790);
              multi_kv_custom_cmp_test()::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x790,"void multi_kv_custom_cmp_test()");
            }
            fdb_doc_free(doc);
          }
          fVar3 = fdb_commit(dbfile,'\0');
          if (fVar3 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x794);
            multi_kv_custom_cmp_test()::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x794,"void multi_kv_custom_cmp_test()");
          }
          uVar7 = 0;
          while( true ) {
            if (uVar7 == 1000) {
              uVar7 = 0;
              while (uVar7 != 1000) {
                sprintf(key,"key%06d",(ulong)uVar7);
                local_574 = uVar7;
                sprintf(value,"value%08d(%s)",(ulong)uVar7);
                sVar5 = strlen(key);
                sVar6 = strlen(value);
                fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,value,sVar6 + 1);
                fVar3 = fdb_set(db,doc);
                if (fVar3 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7b5);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7b5,"void multi_kv_custom_cmp_test()");
                }
                fdb_doc_free(doc);
                uVar7 = local_574;
                sprintf(key,"key%06d",(ulong)local_574);
                sprintf(value,"value%08d(%s)",(ulong)uVar7);
                sVar5 = strlen(key);
                sVar6 = strlen(value);
                fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,value,sVar6 + 1);
                fVar3 = fdb_set(kv1,doc);
                if (fVar3 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7bc);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7bc,"void multi_kv_custom_cmp_test()");
                }
                fdb_doc_free(doc);
                uVar7 = local_574;
                sprintf(key,"key%06d",(ulong)local_574);
                sprintf(value,"value%08d(%s)",(ulong)uVar7);
                sVar5 = strlen(key);
                sVar6 = strlen(value);
                fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,value,sVar6 + 1);
                fVar3 = fdb_set(kv2,doc);
                if (fVar3 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7c3);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7c3,"void multi_kv_custom_cmp_test()");
                }
                fdb_doc_free(doc);
                uVar7 = local_574 + 1;
              }
              fVar3 = fdb_commit(dbfile,'\0');
              if (fVar3 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x7c8);
                multi_kv_custom_cmp_test()::__test_pass = 1;
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7c8,"void multi_kv_custom_cmp_test()");
              }
              uVar7 = 0;
              while( true ) {
                if (uVar7 == 1000) {
                  fVar3 = fdb_compact(dbfile,"./multi_kv_test2");
                  if (fVar3 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7e5);
                    multi_kv_custom_cmp_test()::__test_pass = 1;
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x7e5,"void multi_kv_custom_cmp_test()");
                  }
                  uVar7 = 0;
                  while( true ) {
                    if (uVar7 == 1000) {
                      fVar3 = fdb_doc_create(&doc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
                      if (fVar3 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x802);
                        multi_kv_custom_cmp_test()::__test_pass = 1;
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x802,"void multi_kv_custom_cmp_test()");
                      }
                      doc->key = keyBuf;
                      doc->body = valueBuf;
                      fVar3 = fdb_iterator_init(kv1,&it,(void *)0x0,0,(void *)0x0,0,0);
                      if (fVar3 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x809);
                        multi_kv_custom_cmp_test()::__test_pass = 1;
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x809,"void multi_kv_custom_cmp_test()");
                      }
                      uVar8 = 0;
                      do {
                        fVar3 = fdb_iterator_get(it,&doc);
                        if (fVar3 != FDB_RESULT_SUCCESS) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x80c);
                          multi_kv_custom_cmp_test()::__test_pass = 1;
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x80c,"void multi_kv_custom_cmp_test()");
                        }
                        sprintf(key,"key%06d",uVar8);
                        sprintf(value,"value%08d(%s)",uVar8,"kv1_custom_cmp(updated)");
                        pfVar2 = doc;
                        pvVar1 = doc->key;
                        iVar4 = bcmp(pvVar1,key,doc->keylen);
                        if (iVar4 != 0) {
                          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x80f);
                          multi_kv_custom_cmp_test()::__test_pass = 1;
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x80f,"void multi_kv_custom_cmp_test()");
                        }
                        pvVar1 = pfVar2->body;
                        iVar4 = bcmp(pvVar1,value,pfVar2->bodylen);
                        if (iVar4 != 0) {
                          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x810);
                          multi_kv_custom_cmp_test()::__test_pass = 1;
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x810,"void multi_kv_custom_cmp_test()");
                        }
                        uVar7 = (int)uVar8 + 1;
                        uVar8 = (ulong)uVar7;
                        fVar3 = fdb_iterator_next(it);
                      } while (fVar3 == FDB_RESULT_SUCCESS);
                      if (uVar7 != 1000) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x813);
                        multi_kv_custom_cmp_test()::__test_pass = 1;
                        __assert_fail("i == n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x813,"void multi_kv_custom_cmp_test()");
                      }
                      fVar3 = fdb_iterator_close(it);
                      if (fVar3 == FDB_RESULT_SUCCESS) {
                        fVar3 = fdb_close(dbfile);
                        if (fVar3 != FDB_RESULT_SUCCESS) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x818);
                          multi_kv_custom_cmp_test()::__test_pass = 1;
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x818,"void multi_kv_custom_cmp_test()");
                        }
                        fVar3 = fdb_shutdown();
                        if (fVar3 == FDB_RESULT_SUCCESS) {
                          doc->key = (void *)0x0;
                          doc->body = (void *)0x0;
                          fVar3 = fdb_doc_free(doc);
                          if (fVar3 == FDB_RESULT_SUCCESS) {
                            memleak_end();
                            __format = "%s PASSED\n";
                            if (multi_kv_custom_cmp_test()::__test_pass != '\0') {
                              __format = "%s FAILED\n";
                            }
                            fprintf(_stderr,__format,
                                    "multiple KV instances custom comparison function test");
                            return;
                          }
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x81f);
                          multi_kv_custom_cmp_test()::__test_pass = 1;
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x81f,"void multi_kv_custom_cmp_test()");
                        }
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x81a);
                        multi_kv_custom_cmp_test()::__test_pass = 1;
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x81a,"void multi_kv_custom_cmp_test()");
                      }
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x815);
                      multi_kv_custom_cmp_test()::__test_pass = 1;
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x815,"void multi_kv_custom_cmp_test()");
                    }
                    sprintf(key,"key%06d",(ulong)uVar7);
                    sprintf(value,"value%08d(%s)",(ulong)uVar7);
                    sVar5 = strlen(key);
                    fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
                    fVar3 = fdb_get(db,doc);
                    pfVar2 = doc;
                    if (fVar3 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7ed);
                      multi_kv_custom_cmp_test()::__test_pass = 1;
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7ed,"void multi_kv_custom_cmp_test()");
                    }
                    pvVar1 = doc->body;
                    iVar4 = bcmp(value,pvVar1,doc->bodylen);
                    if (iVar4 != 0) {
                      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7ee);
                      multi_kv_custom_cmp_test()::__test_pass = 1;
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7ee,"void multi_kv_custom_cmp_test()");
                    }
                    fdb_doc_free(pfVar2);
                    sprintf(value,"value%08d(%s)",(ulong)uVar7);
                    sVar5 = strlen(key);
                    fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
                    fVar3 = fdb_get(kv1,doc);
                    pfVar2 = doc;
                    if (fVar3 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7f4);
                      multi_kv_custom_cmp_test()::__test_pass = 1;
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7f4,"void multi_kv_custom_cmp_test()");
                    }
                    pvVar1 = doc->body;
                    iVar4 = bcmp(value,pvVar1,doc->bodylen);
                    if (iVar4 != 0) break;
                    fdb_doc_free(pfVar2);
                    sprintf(value,"value%08d(%s)",(ulong)uVar7);
                    sVar5 = strlen(key);
                    fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
                    fVar3 = fdb_get(kv2,doc);
                    pfVar2 = doc;
                    if (fVar3 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7fb);
                      multi_kv_custom_cmp_test()::__test_pass = 1;
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7fb,"void multi_kv_custom_cmp_test()");
                    }
                    pvVar1 = doc->body;
                    iVar4 = bcmp(value,pvVar1,doc->bodylen);
                    if (iVar4 != 0) {
                      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7fc);
                      multi_kv_custom_cmp_test()::__test_pass = 1;
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7fc,"void multi_kv_custom_cmp_test()");
                    }
                    fdb_doc_free(pfVar2);
                    uVar7 = uVar7 + 1;
                  }
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7f5);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7f5,"void multi_kv_custom_cmp_test()");
                }
                sprintf(key,"key%06d",(ulong)uVar7);
                sprintf(value,"value%08d(%s)",(ulong)uVar7);
                sVar5 = strlen(key);
                fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
                fVar3 = fdb_get(db,doc);
                pfVar2 = doc;
                if (fVar3 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,2000);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,2000,"void multi_kv_custom_cmp_test()");
                }
                pvVar1 = doc->body;
                iVar4 = bcmp(value,pvVar1,doc->bodylen);
                if (iVar4 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7d1);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7d1,"void multi_kv_custom_cmp_test()");
                }
                fdb_doc_free(pfVar2);
                sprintf(value,"value%08d(%s)",(ulong)uVar7);
                sVar5 = strlen(key);
                fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
                fVar3 = fdb_get(kv1,doc);
                pfVar2 = doc;
                if (fVar3 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7d7);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7d7,"void multi_kv_custom_cmp_test()");
                }
                pvVar1 = doc->body;
                iVar4 = bcmp(value,pvVar1,doc->bodylen);
                if (iVar4 != 0) break;
                fdb_doc_free(pfVar2);
                sprintf(value,"value%08d(%s)",(ulong)uVar7);
                sVar5 = strlen(key);
                fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
                fVar3 = fdb_get(kv2,doc);
                pfVar2 = doc;
                if (fVar3 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7de);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7de,"void multi_kv_custom_cmp_test()");
                }
                pvVar1 = doc->body;
                iVar4 = bcmp(value,pvVar1,doc->bodylen);
                if (iVar4 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7df);
                  multi_kv_custom_cmp_test()::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7df,"void multi_kv_custom_cmp_test()");
                }
                fdb_doc_free(pfVar2);
                uVar7 = uVar7 + 1;
              }
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7d8);
              multi_kv_custom_cmp_test()::__test_pass = 1;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7d8,"void multi_kv_custom_cmp_test()");
            }
            sprintf(key,"key%06d",(ulong)uVar7);
            sprintf(value,"value%08d(%s)",(ulong)uVar7);
            sVar5 = strlen(key);
            fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
            fVar3 = fdb_get(db,doc);
            pfVar2 = doc;
            if (fVar3 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x79c);
              multi_kv_custom_cmp_test()::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x79c,"void multi_kv_custom_cmp_test()");
            }
            pvVar1 = doc->body;
            iVar4 = bcmp(value,pvVar1,doc->bodylen);
            if (iVar4 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x79d);
              multi_kv_custom_cmp_test()::__test_pass = 1;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x79d,"void multi_kv_custom_cmp_test()");
            }
            fdb_doc_free(pfVar2);
            sprintf(value,"value%08d(%s)",(ulong)uVar7);
            sVar5 = strlen(key);
            fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
            fVar3 = fdb_get(kv1,doc);
            pfVar2 = doc;
            if (fVar3 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7a3);
              multi_kv_custom_cmp_test()::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7a3,"void multi_kv_custom_cmp_test()");
            }
            pvVar1 = doc->body;
            iVar4 = bcmp(value,pvVar1,doc->bodylen);
            if (iVar4 != 0) break;
            fdb_doc_free(pfVar2);
            sprintf(value,"value%08d(%s)",(ulong)uVar7);
            sVar5 = strlen(key);
            fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
            fVar3 = fdb_get(kv2,doc);
            pfVar2 = doc;
            if (fVar3 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7aa);
              multi_kv_custom_cmp_test()::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7aa,"void multi_kv_custom_cmp_test()");
            }
            pvVar1 = doc->body;
            iVar4 = bcmp(value,pvVar1,doc->bodylen);
            if (iVar4 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7ab);
              multi_kv_custom_cmp_test()::__test_pass = 1;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7ab,"void multi_kv_custom_cmp_test()");
            }
            fdb_doc_free(pfVar2);
            uVar7 = uVar7 + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x7a4);
          multi_kv_custom_cmp_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x7a4,"void multi_kv_custom_cmp_test()");
        }
        sprintf(key,"key%06d",(ulong)uVar7);
        sprintf(value,"value%08d(%s)",(ulong)uVar7);
        sVar5 = strlen(key);
        fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
        fVar3 = fdb_get(db,doc);
        pfVar2 = doc;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x779);
          multi_kv_custom_cmp_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x779,"void multi_kv_custom_cmp_test()");
        }
        pvVar1 = doc->body;
        iVar4 = bcmp(value,pvVar1,doc->bodylen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x77a);
          multi_kv_custom_cmp_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x77a,"void multi_kv_custom_cmp_test()");
        }
        fdb_doc_free(pfVar2);
        sprintf(value,"value%08d(%s)",(ulong)uVar7);
        sVar5 = strlen(key);
        fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
        fVar3 = fdb_get(kv1,doc);
        pfVar2 = doc;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x780);
          multi_kv_custom_cmp_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x780,"void multi_kv_custom_cmp_test()");
        }
        pvVar1 = doc->body;
        iVar4 = bcmp(value,pvVar1,doc->bodylen);
        if (iVar4 != 0) break;
        fdb_doc_free(pfVar2);
        uVar7 = uVar7 + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x781);
      multi_kv_custom_cmp_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x781,"void multi_kv_custom_cmp_test()");
    }
    sprintf(key,"key%06d",(ulong)uVar7);
    sprintf(value,"value%08d(%s)",(ulong)uVar7);
    sVar5 = strlen(key);
    fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db,doc);
    pfVar2 = doc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x74b);
      multi_kv_custom_cmp_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x74b,"void multi_kv_custom_cmp_test()");
    }
    pvVar1 = doc->body;
    iVar4 = bcmp(value,pvVar1,doc->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x74c);
      multi_kv_custom_cmp_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x74c,"void multi_kv_custom_cmp_test()");
    }
    fdb_doc_free(pfVar2);
    sprintf(value,"value%08d(%s)",(ulong)uVar7);
    sVar5 = strlen(key);
    fdb_doc_create(&doc,key,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(kv1,doc);
    pfVar2 = doc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x752);
      multi_kv_custom_cmp_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x752,"void multi_kv_custom_cmp_test()");
    }
    pvVar1 = doc->body;
    iVar4 = bcmp(value,pvVar1,doc->bodylen);
    if (iVar4 != 0) break;
    fdb_doc_free(pfVar2);
    uVar7 = uVar7 + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
          ,0x753);
  multi_kv_custom_cmp_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x753,"void multi_kv_custom_cmp_test()");
}

Assistant:

void multi_kv_custom_cmp_test()
{
    TEST_INIT();

    int n = 1000;
    int i, r;
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_iterator *it;
    fdb_status s;

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.multi_kv_instances = true;
    config.wal_threshold = 256;
    config.wal_flush_before_commit = false;
    config.buffercache_size = 0;

    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'default' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create 'kv1' using custom cmp function
    kvs_config.custom_cmp = _multi_kv_test_keycmp;
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & reopen handles
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    kvs_config.custom_cmp = NULL;
    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail

    { // retry with wrong cmp function
        char *kvs_names[] = {NULL};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail
    }

    { // retry with correct function
        char *kvs_names[] = {(char*)"kv1"};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS); // must succeed this time
    }

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // create one more KV store
    kvs_config.custom_cmp = NULL;
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv2' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // update all documents
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    // WAL flush at once
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // do compaction
    s = fdb_compact(dbfile, "./multi_kv_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // pre-allocate memory and re-use it for the iterator return document
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->body = &valueBuf[0];

    // create full iterator for 'kv1'
    i = 0;
    s = fdb_iterator_init(kv1, &it, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    do {
        s = fdb_iterator_get(it, &doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        i++;
    } while (fdb_iterator_next(it) == FDB_RESULT_SUCCESS);
    TEST_CHK(i == n);
    s = fdb_iterator_close(it);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // release the pre-allocated memory for the iterator return document
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();

    TEST_RESULT("multiple KV instances custom comparison function test");
}